

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

void Dar_LibIncrementScore(int Class,int Out,int Gain)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int Out2;
  int *pScore;
  int *pPlace;
  int *pPrios;
  int Gain_local;
  int Out_local;
  int Class_local;
  
  piVar2 = s_DarLib->pPrios[Class];
  piVar3 = s_DarLib->pPlace[Class];
  piVar4 = s_DarLib->pScore[Class];
  if ((Class < 0) || (0xdd < Class)) {
    __assert_fail("Class >= 0 && Class < 222",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                  ,0x27f,"void Dar_LibIncrementScore(int, int, int)");
  }
  if ((-1 < Out) && (Out < s_DarLib->nSubgr[Class])) {
    if (piVar3[piVar2[Out]] == Out) {
      piVar4[Out] = Gain + piVar4[Out];
      while( true ) {
        bVar5 = false;
        if (0 < piVar3[Out]) {
          bVar5 = piVar4[piVar2[piVar3[Out] + -1]] < piVar4[Out];
        }
        if (!bVar5) break;
        iVar1 = piVar2[piVar3[Out] + -1];
        piVar3[Out] = piVar3[Out] + -1;
        piVar3[iVar1] = piVar3[iVar1] + 1;
        piVar2[piVar3[Out]] = Out;
        piVar2[piVar3[iVar1]] = iVar1;
      }
      return;
    }
    __assert_fail("pPlace[pPrios[Out]] == Out",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                  ,0x281,"void Dar_LibIncrementScore(int, int, int)");
  }
  __assert_fail("Out >= 0 && Out < s_DarLib->nSubgr[Class]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dar/darLib.c"
                ,0x280,"void Dar_LibIncrementScore(int, int, int)");
}

Assistant:

void Dar_LibIncrementScore( int Class, int Out, int Gain )
{
    int * pPrios = s_DarLib->pPrios[Class];  // pPrios[i] = Out
    int * pPlace = s_DarLib->pPlace[Class];  // pPlace[Out] = i
    int * pScore = s_DarLib->pScore[Class];  // score of Out
    int Out2;
    assert( Class >= 0 && Class < 222 );
    assert( Out >= 0 && Out < s_DarLib->nSubgr[Class] );
    assert( pPlace[pPrios[Out]] == Out );
    // increment the score
    pScore[Out] += Gain;
    // move the out in the order 
    while ( pPlace[Out] > 0 && pScore[Out] > pScore[ pPrios[pPlace[Out]-1] ] )
    {
        // get the previous output in the priority list
        Out2 = pPrios[pPlace[Out]-1];
        // swap Out and Out2
        pPlace[Out]--;
        pPlace[Out2]++;
        pPrios[pPlace[Out]] = Out;
        pPrios[pPlace[Out2]] = Out2;
    }
}